

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O0

png_charp png_format_number(png_const_charp start,png_charp end,int format,png_alloc_size_t number)

{
  bool bVar1;
  bool local_36;
  int local_30;
  int output;
  int mincount;
  int count;
  png_alloc_size_t number_local;
  png_charp pcStack_18;
  int format_local;
  png_charp end_local;
  png_const_charp start_local;
  
  output = 0;
  local_30 = 1;
  bVar1 = false;
  end[-1] = '\0';
  _mincount = number;
  pcStack_18 = end + -1;
  while( true ) {
    local_36 = false;
    if (start < pcStack_18) {
      local_36 = _mincount != 0 || output < local_30;
    }
    if (!local_36) break;
    switch(format) {
    case 2:
      local_30 = 2;
    case 1:
      pcStack_18[-1] = "0123456789ABCDEF"[_mincount % 10];
      _mincount = _mincount / 10;
      pcStack_18 = pcStack_18 + -1;
      break;
    case 4:
      local_30 = 2;
    case 3:
      pcStack_18[-1] = "0123456789ABCDEF"[_mincount & 0xf];
      _mincount = _mincount >> 4;
      pcStack_18 = pcStack_18 + -1;
      break;
    case 5:
      local_30 = 5;
      if ((bVar1) || (_mincount % 10 != 0)) {
        pcStack_18[-1] = "0123456789ABCDEF"[_mincount % 10];
        bVar1 = true;
        pcStack_18 = pcStack_18 + -1;
      }
      _mincount = _mincount / 10;
      break;
    default:
      _mincount = 0;
    }
    output = output + 1;
    if (((format == 5) && (output == 5)) && (start < pcStack_18)) {
      if (bVar1) {
        pcStack_18[-1] = '.';
        pcStack_18 = pcStack_18 + -1;
      }
      else if (_mincount == 0) {
        pcStack_18[-1] = '0';
        pcStack_18 = pcStack_18 + -1;
      }
    }
  }
  return pcStack_18;
}

Assistant:

png_charp
png_format_number(png_const_charp start, png_charp end, int format,
    png_alloc_size_t number)
{
   int count = 0;    /* number of digits output */
   int mincount = 1; /* minimum number required */
   int output = 0;   /* digit output (for the fixed point format) */

   *--end = '\0';

   /* This is written so that the loop always runs at least once, even with
    * number zero.
    */
   while (end > start && (number != 0 || count < mincount))
   {

      static const char digits[] = "0123456789ABCDEF";

      switch (format)
      {
         case PNG_NUMBER_FORMAT_fixed:
            /* Needs five digits (the fraction) */
            mincount = 5;
            if (output != 0 || number % 10 != 0)
            {
               *--end = digits[number % 10];
               output = 1;
            }
            number /= 10;
            break;

         case PNG_NUMBER_FORMAT_02u:
            /* Expects at least 2 digits. */
            mincount = 2;
            /* FALLTHROUGH */

         case PNG_NUMBER_FORMAT_u:
            *--end = digits[number % 10];
            number /= 10;
            break;

         case PNG_NUMBER_FORMAT_02x:
            /* This format expects at least two digits */
            mincount = 2;
            /* FALLTHROUGH */

         case PNG_NUMBER_FORMAT_x:
            *--end = digits[number & 0xf];
            number >>= 4;
            break;

         default: /* an error */
            number = 0;
            break;
      }

      /* Keep track of the number of digits added */
      ++count;

      /* Float a fixed number here: */
      if ((format == PNG_NUMBER_FORMAT_fixed) && (count == 5) && (end > start))
      {
         /* End of the fraction, but maybe nothing was output?  In that case
          * drop the decimal point.  If the number is a true zero handle that
          * here.
          */
         if (output != 0)
            *--end = '.';
         else if (number == 0) /* and !output */
            *--end = '0';
      }
   }

   return end;
}